

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O2

int gost_grasshopper_mgm_cleanup(EVP_CIPHER_CTX *c)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  lVar2 = EVP_CIPHER_CTX_get_cipher_data();
  if (lVar2 == 0) {
    iVar5 = 0;
  }
  else {
    *(undefined8 *)(lVar2 + 0x38) = 0;
    *(undefined8 *)(lVar2 + 0x40) = 0;
    *(undefined8 *)(lVar2 + 0x28) = 0;
    *(undefined8 *)(lVar2 + 0x30) = 0;
    *(undefined8 *)(lVar2 + 0x18) = 0;
    *(undefined8 *)(lVar2 + 0x20) = 0;
    *(undefined8 *)(lVar2 + 8) = 0;
    *(undefined8 *)(lVar2 + 0x10) = 0;
    for (lVar3 = 0x48; lVar3 != 0xe8; lVar3 = lVar3 + 0x10) {
      *(undefined8 *)(lVar2 + lVar3) = 0;
      ((undefined8 *)(lVar2 + lVar3))[1] = 0;
    }
    for (lVar3 = 0; lVar3 != 0xa0; lVar3 = lVar3 + 0x10) {
      puVar1 = (undefined8 *)(lVar2 + 0xe8 + lVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
    *(undefined8 *)(lVar2 + 0x188) = 0;
    *(undefined8 *)(lVar2 + 400) = 0;
    OPENSSL_cleanse((void *)(lVar2 + 0x1090),200);
    lVar3 = *(long *)(lVar2 + 0x1158);
    lVar4 = EVP_CIPHER_CTX_iv_noconst(c);
    iVar5 = 1;
    if (lVar3 != lVar4) {
      CRYPTO_free(*(void **)(lVar2 + 0x1158));
    }
  }
  return iVar5;
}

Assistant:

static int gost_grasshopper_mgm_cleanup(EVP_CIPHER_CTX *c)
{
    gost_mgm_ctx *mctx =
        (gost_mgm_ctx *)EVP_CIPHER_CTX_get_cipher_data(c);
    if (mctx == NULL)
        return 0;
    gost_grasshopper_cipher_destroy(&mctx->ks.gh_ks);
    OPENSSL_cleanse(&mctx->mgm, sizeof(mctx->mgm));
    if (mctx->iv != EVP_CIPHER_CTX_iv_noconst(c))
        OPENSSL_free(mctx->iv);
    return 1;
}